

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O0

int flatcc_verify_table_vector_field
              (flatcc_table_verifier_descriptor_t *td,flatbuffers_voffset_t id,int required,
              flatcc_table_verifier_f *tvf)

{
  flatbuffers_uoffset_t end;
  void *buf;
  flatbuffers_uoffset_t offset;
  flatbuffers_uoffset_t local_2c;
  int ret;
  flatbuffers_uoffset_t base;
  flatcc_table_verifier_f *tvf_local;
  int required_local;
  flatbuffers_voffset_t id_local;
  flatcc_table_verifier_descriptor_t *td_local;
  
  _ret = tvf;
  tvf_local._0_4_ = required;
  tvf_local._6_2_ = id;
  _required_local = td;
  td_local._4_4_ = get_offset_field(td,id,required,&local_2c);
  if ((td_local._4_4_ == 0) && (local_2c != 0)) {
    buf = _required_local->buf;
    end = _required_local->end;
    offset = read_uoffset(_required_local->buf,local_2c);
    td_local._4_4_ = verify_table_vector(buf,end,local_2c,offset,_required_local->ttl,_ret);
  }
  return td_local._4_4_;
}

Assistant:

int flatcc_verify_table_vector_field(flatcc_table_verifier_descriptor_t *td,
        voffset_t id, int required, flatcc_table_verifier_f tvf)
{
    uoffset_t base;

    check_field(td, id, required, base);
    return verify_table_vector(td->buf, td->end, base, read_uoffset(td->buf, base), td->ttl, tvf);
}